

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.h
# Opt level: O3

void __thiscall vkb::Result<vkb::Device>::Result(Result<vkb::Device> *this,Device *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  pointer pbVar5;
  pointer pVVar6;
  pointer pGVar7;
  VkAllocationCallbacks *pVVar8;
  PFN_vkGetDeviceProcAddr p_Var9;
  PFN_vkGetDeviceQueue p_Var10;
  bool bVar11;
  undefined2 uVar12;
  Suitable SVar13;
  
  (this->field_0).m_value.device = value->device;
  paVar1 = &(this->field_0).m_value.physical_device.name.field_2;
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)((long)&this->field_0 + 8) = paVar1;
  pcVar3 = (value->physical_device).name._M_dataplus._M_p;
  paVar2 = &(value->physical_device).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(value->physical_device).name.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->field_0).m_value.physical_device.name.field_2 + 8) = uVar4;
  }
  else {
    (this->field_0).m_value.physical_device.name._M_dataplus._M_p = pcVar3;
    (this->field_0).m_value.physical_device.name.field_2._M_allocated_capacity =
         paVar2->_M_allocated_capacity;
  }
  (this->field_0).m_value.physical_device.name._M_string_length =
       (value->physical_device).name._M_string_length;
  (value->physical_device).name._M_dataplus._M_p = (pointer)paVar2;
  (value->physical_device).name._M_string_length = 0;
  (value->physical_device).name.field_2._M_local_buf[0] = '\0';
  memcpy((void *)((long)&this->field_0 + 0x28),&(value->physical_device).physical_device,0x634);
  pbVar5 = (value->physical_device).extensions_to_enable.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->field_0).m_value.physical_device.extensions_to_enable.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (value->physical_device).extensions_to_enable.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->field_0).m_value.physical_device.extensions_to_enable.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
  (this->field_0).m_value.physical_device.extensions_to_enable.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (value->physical_device).extensions_to_enable.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (value->physical_device).extensions_to_enable.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (value->physical_device).extensions_to_enable.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (value->physical_device).extensions_to_enable.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar5 = (value->physical_device).available_extensions.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->field_0).m_value.physical_device.available_extensions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (value->physical_device).available_extensions.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->field_0).m_value.physical_device.available_extensions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
  (this->field_0).m_value.physical_device.available_extensions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (value->physical_device).available_extensions.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (value->physical_device).available_extensions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (value->physical_device).available_extensions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (value->physical_device).available_extensions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pVVar6 = (value->physical_device).queue_families.
           super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->field_0).m_value.physical_device.queue_families.
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_start =
       (value->physical_device).queue_families.
       super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl
       .super__Vector_impl_data._M_start;
  (this->field_0).m_value.physical_device.queue_families.
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_finish = pVVar6;
  (this->field_0).m_value.physical_device.queue_families.
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (value->physical_device).queue_families.
       super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  (value->physical_device).queue_families.
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (value->physical_device).queue_families.
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (value->physical_device).queue_families.
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pGVar7 = (value->physical_device).extended_features_chain.nodes.
           super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->field_0).m_value.physical_device.extended_features_chain.nodes.
  super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (value->physical_device).extended_features_chain.nodes.
       super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(this->field_0).m_value.physical_device.extended_features_chain.nodes.
           super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
           ._M_impl.super__Vector_impl_data + 8) = pGVar7;
  *(pointer *)
   ((long)&(this->field_0).m_value.physical_device.extended_features_chain.nodes.
           super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
           ._M_impl.super__Vector_impl_data + 0x10) =
       (value->physical_device).extended_features_chain.nodes.
       super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (value->physical_device).extended_features_chain.nodes.
  super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (value->physical_device).extended_features_chain.nodes.
  super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (value->physical_device).extended_features_chain.nodes.
  super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar11 = (value->physical_device).properties2_ext_enabled;
  uVar12 = *(undefined2 *)&(value->physical_device).field_0x6ba;
  SVar13 = (value->physical_device).suitable;
  *(bool *)((long)&this->field_0 + 0x6c0) = (value->physical_device).defer_surface_initialization;
  *(bool *)((long)&this->field_0 + 0x6c1) = bVar11;
  *(undefined2 *)((long)&this->field_0 + 0x6c2) = uVar12;
  *(Suitable *)((long)&this->field_0 + 0x6c4) = SVar13;
  pVVar6 = (value->queue_families).
           super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->field_0).m_value.surface = value->surface;
  (this->field_0).m_value.queue_families.
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_start = pVVar6;
  pVVar6 = (value->queue_families).
           super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->field_0).m_value.queue_families.
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (value->queue_families).
       super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl
       .super__Vector_impl_data._M_finish;
  (this->field_0).m_value.queue_families.
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pVVar6;
  (value->queue_families).
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (value->queue_families).
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (value->queue_families).
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->field_0).m_value.internal_table.fp_vkDestroyDevice =
       (value->internal_table).fp_vkDestroyDevice;
  pVVar8 = value->allocation_callbacks;
  p_Var9 = value->fp_vkGetDeviceProcAddr;
  p_Var10 = (value->internal_table).fp_vkGetDeviceQueue;
  *(undefined8 *)((long)&this->field_0 + 0x6f8) = *(undefined8 *)&value->instance_version;
  (this->field_0).m_value.internal_table.fp_vkGetDeviceQueue = p_Var10;
  (this->field_0).m_value.allocation_callbacks = pVVar8;
  (this->field_0).m_value.fp_vkGetDeviceProcAddr = p_Var9;
  this->m_init = true;
  return;
}

Assistant:

Result(T&& value) noexcept : m_value{ std::move(value) }, m_init{ true } {}